

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.h
# Opt level: O0

bool __thiscall jbcoin::STPathElement::operator==(STPathElement *this,STPathElement *t)

{
  bool bVar1;
  bool local_19;
  STPathElement *t_local;
  STPathElement *this_local;
  
  local_19 = false;
  if (((this->mType & 1) == (t->mType & 1)) &&
     (local_19 = false, this->hash_value_ == t->hash_value_)) {
    bVar1 = jbcoin::operator==(&this->mAccountID,&t->mAccountID);
    local_19 = false;
    if (bVar1) {
      bVar1 = jbcoin::operator==(&this->mCurrencyID,&t->mCurrencyID);
      local_19 = false;
      if (bVar1) {
        local_19 = jbcoin::operator==(&this->mIssuerID,&t->mIssuerID);
      }
    }
  }
  return local_19;
}

Assistant:

bool
    operator== (const STPathElement& t) const
    {
        return (mType & typeAccount) == (t.mType & typeAccount) &&
            hash_value_ == t.hash_value_ &&
            mAccountID == t.mAccountID &&
            mCurrencyID == t.mCurrencyID &&
            mIssuerID == t.mIssuerID;
    }